

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumHelpers.hpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
enum_to_str<FileSection>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FileSection p_enum_value,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
          *p_mapping)

{
  bool bVar1;
  reference ppVar2;
  undefined1 local_60 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>
  pair;
  iterator __end0;
  iterator __begin0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
  *p_mapping_local;
  FileSection p_enum_value_local;
  
  __end0 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
           ::begin(p_mapping);
  pair._32_8_ = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
                ::end(p_mapping);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&pair.second);
    if (!bVar1) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>
             ::operator*(&__end0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>
            *)local_60,ppVar2);
    bVar1 = pair.first.field_2._8_4_ == p_enum_value;
    if (bVar1) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>
             *)local_60);
    if (bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<string> enum_to_str(E p_enum_value, map<string,E,ci_less> p_mapping)
{
	for(auto pair : p_mapping)
	{
		if(pair.second == p_enum_value)
		{
			return optional<string>(pair.first);
		}
	}

	return std::nullopt;
}